

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

exr_result_t
hufEncode(uint64_t *hcode,uint16_t *in,uint64_t ni,uint32_t rlc,uint8_t *out,uint8_t *outend,
         uint32_t *outbytes)

{
  ulong uVar1;
  uint8_t **in_RDX;
  short *in_RSI;
  uint8_t *in_R8;
  uint8_t *in_R9;
  undefined4 *in_stack_00000008;
  uint64_t i;
  int cs;
  uint16_t s;
  int lc;
  uint64_t c;
  uint8_t *outStart;
  exr_result_t rv;
  uint8_t **out_00;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar2;
  undefined2 in_stack_ffffffffffffffa8;
  short sVar3;
  int iVar4;
  uint64_t runCode;
  uint in_stack_ffffffffffffffc0;
  uint8_t *outend_00;
  exr_result_t local_4;
  
  local_4 = 0;
  runCode = 0;
  iVar4 = 0;
  sVar3 = *in_RSI;
  iVar2 = 0;
  outend_00 = in_R8;
  for (out_00 = (uint8_t **)0x1; out_00 < in_RDX; out_00 = (uint8_t **)((long)out_00 + 1)) {
    if ((sVar3 == in_RSI[(long)out_00]) && (iVar2 < 0xff)) {
      iVar2 = iVar2 + 1;
    }
    else {
      local_4 = sendCode(CONCAT44(local_4,in_stack_ffffffffffffffc0),(int)((ulong)in_R8 >> 0x20),
                         runCode,(uint64_t *)
                                 CONCAT44(iVar4,CONCAT22(sVar3,in_stack_ffffffffffffffa8)),
                         (int *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),out_00,outend_00);
      if (local_4 != 0) break;
      iVar2 = 0;
    }
    sVar3 = in_RSI[(long)out_00];
  }
  if (local_4 == 0) {
    local_4 = sendCode((ulong)in_stack_ffffffffffffffc0,(int)((ulong)in_R8 >> 0x20),runCode,
                       (uint64_t *)CONCAT44(iVar4,CONCAT22(sVar3,in_stack_ffffffffffffffa8)),
                       (int *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),out_00,outend_00);
  }
  if (local_4 == 0) {
    if (iVar4 != 0) {
      if (in_R9 <= outend_00) {
        return 4;
      }
      *outend_00 = (uint8_t)(runCode << (8U - (char)iVar4 & 0x3f));
    }
    uVar1 = ((long)outend_00 - (long)in_R8) * 8 + (long)iVar4;
    if (uVar1 < 0x100000000) {
      *in_stack_00000008 = (int)uVar1;
    }
    else {
      local_4 = 4;
    }
  }
  return local_4;
}

Assistant:

static inline exr_result_t
hufEncode (
    const uint64_t* hcode,
    const uint16_t* in,
    const uint64_t  ni,
    uint32_t        rlc,
    uint8_t*        out,
    uint8_t*        outend,
    uint32_t*       outbytes)
{
    exr_result_t rv = EXR_ERR_SUCCESS;

    uint8_t* outStart = out;
    uint64_t c        = 0; // bits not yet written to out
    int      lc       = 0; // number of valid bits in c (LSB)
    uint16_t s        = in[0];
    int      cs       = 0;

    //
    // Loop on input values
    //

    for (uint64_t i = 1; i < ni; i++)
    {
        //
        // Count same values or send code
        //

        if (s == in[i] && cs < 255) { cs++; }
        else
        {
            rv = sendCode (hcode[s], cs, hcode[rlc], &c, &lc, &out, outend);
            if (rv != EXR_ERR_SUCCESS) break;
            cs = 0;
        }

        s = in[i];
    }

    //
    // Send remaining code
    //

    if (rv == EXR_ERR_SUCCESS)
        rv = sendCode (hcode[s], cs, hcode[rlc], &c, &lc, &out, outend);

    if (rv == EXR_ERR_SUCCESS)
    {
        if (lc)
        {
            if (out >= outend) return EXR_ERR_ARGUMENT_OUT_OF_RANGE;
            *out = (c << (8 - lc)) & 0xff;
        }

        c = (((uintptr_t) out) - ((uintptr_t) outStart)) * 8 + (uint64_t) (lc);
        if (c > (uint64_t) UINT32_MAX) return EXR_ERR_ARGUMENT_OUT_OF_RANGE;
        *outbytes = (uint32_t) c;
    }

    return rv;
}